

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O0

int Cudd_SharingSize(DdNode **nodeArray,int n)

{
  int iVar1;
  int local_1c;
  int local_18;
  int j;
  int i;
  int n_local;
  DdNode **nodeArray_local;
  
  local_18 = 0;
  for (local_1c = 0; local_1c < n; local_1c = local_1c + 1) {
    iVar1 = ddDagInt((DdNode *)((ulong)nodeArray[local_1c] & 0xfffffffffffffffe));
    local_18 = iVar1 + local_18;
  }
  for (local_1c = 0; local_1c < n; local_1c = local_1c + 1) {
    ddClearFlag((DdNode *)((ulong)nodeArray[local_1c] & 0xfffffffffffffffe));
  }
  return local_18;
}

Assistant:

int
Cudd_SharingSize(
  DdNode ** nodeArray,
  int  n)
{
    int i,j;

    i = 0;
    for (j = 0; j < n; j++) {
        i += ddDagInt(Cudd_Regular(nodeArray[j]));
    }
    for (j = 0; j < n; j++) {
        ddClearFlag(Cudd_Regular(nodeArray[j]));
    }
    return(i);

}